

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O0

void cos_maketable(void)

{
  double dVar1;
  tabfudge tf;
  float phsinc;
  float phase;
  float *fp;
  int i;
  
  if (cos_table == (float *)0x0) {
    cos_table = (float *)getbytes(0x804);
    fp._4_4_ = 0x201;
    tf.tf_i[1] = 0;
    _phsinc = cos_table;
    while (fp._4_4_ != 0) {
      dVar1 = cos((double)tf.tf_d._4_4_);
      *_phsinc = (float)dVar1;
      _phsinc = _phsinc + 1;
      tf.tf_i[1] = (int32_t)((float)tf.tf_i[1] + 0.012271836);
      fp._4_4_ = fp._4_4_ + -1;
    }
  }
  return;
}

Assistant:

static void cos_maketable(void)
{
    int i;
    float *fp, phase, phsinc = (2. * 3.14159) / COSTABSIZE;
    union tabfudge tf;

    if (cos_table) return;
    cos_table = (float *)getbytes(sizeof(float) * (COSTABSIZE+1));
    for (i = COSTABSIZE + 1, fp = cos_table, phase = 0; i--;
        fp++, phase += phsinc)
            *fp = cos(phase);

        /* here we check at startup whether the byte alignment
            is as we declared it.  If not, the code has to be
            recompiled the other way. */
    tf.tf_d = UNITBIT32 + 0.5;
    if ((unsigned)tf.tf_i[LOWOFFSET] != 0x80000000)
        bug("cos~: unexpected machine alignment");
}